

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O1

void __thiscall
TEST_TestHarness_c_cpputest_realloc_larger_Test::testBody
          (TEST_TestHarness_c_cpputest_realloc_larger_Test *this)

{
  char *s1;
  UtestShell *pUVar1;
  TestTerminator *pTVar2;
  void *buffer;
  
  s1 = (char *)cpputest_malloc(10);
  SimpleString::StrNCpy(s1,"123456789",10);
  pUVar1 = UtestShell::getCurrent();
  pTVar2 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(s1 != (char *)0x0),"CHECK","mem1 != NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x31e,pTVar2);
  buffer = cpputest_realloc(s1,1000);
  pUVar1 = UtestShell::getCurrent();
  pTVar2 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(buffer != (void *)0x0),"CHECK","mem2 != NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x322,pTVar2);
  pUVar1 = UtestShell::getCurrent();
  pTVar2 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"123456789",buffer,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x323,pTVar2);
  cpputest_free(buffer);
  return;
}

Assistant:

TEST(TestHarness_c, cpputest_realloc_larger)
{
    const char* number_string = "123456789";

    char* mem1 = (char*) cpputest_malloc(10);

    SimpleString::StrNCpy(mem1, number_string, 10);

    CHECK(mem1 != NULLPTR);

    char* mem2 = (char*) cpputest_realloc(mem1, 1000);

    CHECK(mem2 != NULLPTR);
    STRCMP_EQUAL(number_string, mem2);

    cpputest_free(mem2);
}